

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineInputFile::readPixels(DeepScanLineInputFile *this,int scanLine1,int scanLine2)

{
  char **v;
  int iVar1;
  LineOrder LVar2;
  int iVar3;
  Data *pDVar4;
  pointer ppLVar5;
  LineBuffer *pLVar6;
  unsigned_long uVar7;
  InputStreamMutex *pIVar8;
  char *pcVar9;
  pointer ppLVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ArgExc *pAVar15;
  ulong uVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar17;
  Task *this_00;
  InputExc *pIVar18;
  ostream *poVar19;
  IoExc *this_01;
  int iVar20;
  int iVar21;
  string *psVar22;
  long lVar23;
  string *psVar24;
  int iVar25;
  TaskGroup taskGroup;
  stringstream _iex_throw_s;
  ostream local_330 [376];
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar4 = this->_data;
  if ((pDVar4->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar4->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar15,"No frame buffer specified as pixel data destination.");
    __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  iVar25 = scanLine2;
  iVar11 = scanLine1;
  if (scanLine2 < scanLine1) {
    iVar25 = scanLine1;
    iVar11 = scanLine2;
  }
  iVar1 = pDVar4->minY;
  if ((iVar11 < iVar1) || (pDVar4->maxY < iVar25)) {
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc
              (pAVar15,"Tried to read scan line outside the image file\'s data window.");
    __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  if (scanLine2 < scanLine1) {
    scanLine1 = scanLine2;
  }
  lVar23 = (long)scanLine1;
  while (lVar23 <= iVar25) {
    lVar13 = lVar23 - iVar1;
    lVar23 = lVar23 + 1;
    if ((pDVar4->gotSampleCount)._data[lVar13] == false) {
      pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar15,
                 "Tried to read scan line without knowing the sample counts, pleaseread the sample counts first."
                );
      __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  LVar2 = pDVar4->lineOrder;
  iVar3 = pDVar4->linesInBuffer;
  IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
  iVar14 = iVar25;
  iVar12 = iVar11;
  if (LVar2 == INCREASING_Y) {
    iVar14 = iVar11;
    iVar12 = iVar25;
  }
  uVar16 = (ulong)((iVar14 - iVar1) / iVar3);
  do {
    if ((long)(int)((iVar12 - iVar1) / iVar3 + (uint)(LVar2 == INCREASING_Y) * 2 + -1) == uVar16) {
      IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
      ppLVar5 = (this->_data->lineBuffers).
                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppLVar10 = (this->_data->lineBuffers).
                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      psVar22 = (string *)0x0;
      for (lVar23 = 0; (long)ppLVar10 - (long)ppLVar5 >> 3 != lVar23; lVar23 = lVar23 + 1) {
        pLVar6 = ppLVar5[lVar23];
        psVar24 = (string *)&pLVar6->partiallyFull;
        if (psVar22 != (string *)0x0) {
          psVar24 = psVar22;
        }
        if (*(char *)&pLVar6->compressor != '\0') {
          psVar22 = psVar24;
        }
        *(undefined1 *)&pLVar6->compressor = 0;
      }
      if (psVar22 == (string *)0x0) {
        IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
        return;
      }
      this_01 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_01,psVar22);
      __cxa_throw(this_01,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
    pDVar4 = this->_data;
    ppLVar5 = (pDVar4->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar6 = ppLVar5[uVar16 % (ulong)((long)(pDVar4->lineBuffers).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppLVar5 >> 3)];
    IlmThread_2_5::Semaphore::wait();
    iVar14 = (int)uVar16;
    if (iVar14 != pLVar6->scanLineMax) {
      iVar21 = pDVar4->linesInBuffer;
      iVar20 = iVar21 * iVar14 + pDVar4->minY;
      *(int *)&pLVar6->endOfLineBufferData = iVar20;
      *(int *)((long)&pLVar6->endOfLineBufferData + 4) = iVar21 + iVar20 + -1;
      pLVar6->scanLineMax = iVar14;
      (pLVar6->buffer)._size = 0;
      uVar7 = (pDVar4->lineOffsets).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      if (uVar7 == 0) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Scan line ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,iVar20);
        std::operator<<(poVar19," is missing.");
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar18,(stringstream *)&_iex_throw_s);
        __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      pIVar8 = pDVar4->_streamData;
      if ((pDVar4->version & 0x1000) == 0) {
        if (pDVar4->nextLineBufferMinY != iVar20) {
LAB_001cda4f:
          (*pIVar8->is->_vptr_IStream[6])(pIVar8->is,uVar7);
        }
      }
      else {
        iVar14 = (*pIVar8->is->_vptr_IStream[5])();
        if (CONCAT44(extraout_var,iVar14) !=
            (pDVar4->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16]) goto LAB_001cda4f;
      }
      if (((pDVar4->version & 0x1000) != 0) &&
         ((*pIVar8->is->_vptr_IStream[3])(pIVar8->is,&_iex_throw_s,4),
         __iex_throw_s != pDVar4->partNumber)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"Unexpected part number ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,__iex_throw_s);
        poVar19 = std::operator<<(poVar19,", should be ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,pDVar4->partNumber);
        std::operator<<(poVar19,".");
        pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      (*pIVar8->is->_vptr_IStream[3])(pIVar8->is,&_iex_throw_s,4);
      if (__iex_throw_s != iVar20) {
        pIVar18 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar18,"Unexpected data block y coordinate.");
        __cxa_throw(pIVar18,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      (*pIVar8->is->_vptr_IStream[3])(pIVar8->is,&_iex_throw_s,8);
      iVar14 = __iex_throw_s;
      v = &pLVar6->dataPtr;
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar8->is,(unsigned_long *)v);
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar8->is,(unsigned_long *)&pLVar6->dataSize);
      if (((char *)0x7fffffff < *v) || (*(ulong *)&pLVar6->dataSize >> 0x1f != 0)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
        poVar19 = std::operator<<(local_330,"This version of the library does not support ");
        poVar19 = std::operator<<(poVar19,"the allocation of data with size  > ");
        poVar19 = (ostream *)std::ostream::operator<<(poVar19,0x7fffffff);
        poVar19 = std::operator<<(poVar19," file unpacked size :");
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        poVar19 = std::operator<<(poVar19," file packed size   :");
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        std::operator<<(poVar19,".\n");
        pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
        __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
      Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(pIVar8->is,iVar14);
      iVar14 = (*pIVar8->is->_vptr_IStream[2])();
      if ((char)iVar14 == '\0') {
        pcVar9 = (pLVar6->buffer)._data;
        if (pcVar9 != (char *)0x0) {
          operator_delete__(pcVar9);
        }
        pcVar9 = *v;
        pcVar17 = (char *)operator_new__((ulong)pcVar9);
        (pLVar6->buffer)._data = pcVar17;
        (*pIVar8->is->_vptr_IStream[3])(pIVar8->is,pcVar17,(ulong)pcVar9 & 0xffffffff);
      }
      else {
        iVar14 = (*pIVar8->is->_vptr_IStream[4])(pIVar8->is,(ulong)*(uint *)v);
        (pLVar6->buffer)._data = (char *)CONCAT44(extraout_var_00,iVar14);
      }
      iVar14 = -pDVar4->linesInBuffer;
      if (pDVar4->lineOrder == INCREASING_Y) {
        iVar14 = pDVar4->linesInBuffer;
      }
      pDVar4->nextLineBufferMinY = iVar14 + iVar20;
    }
    iVar14 = *(int *)&pLVar6->endOfLineBufferData;
    iVar21 = *(int *)((long)&pLVar6->endOfLineBufferData + 4);
    this_00 = (Task *)operator_new(0x28);
    IlmThread_2_5::Task::Task(this_00,&taskGroup);
    if (iVar25 <= iVar21) {
      iVar21 = iVar25;
    }
    if (iVar14 <= iVar11) {
      iVar14 = iVar11;
    }
    *(undefined ***)this_00 = &PTR__LineBufferTask_004219d0;
    *(Data **)(this_00 + 0x10) = pDVar4;
    *(LineBuffer **)(this_00 + 0x18) = pLVar6;
    *(int *)(this_00 + 0x20) = iVar14;
    *(int *)(this_00 + 0x24) = iVar21;
    IlmThread_2_5::ThreadPool::addGlobalTask(this_00);
    uVar16 = uVar16 + (-(ulong)(LVar2 != INCREASING_Y) | 1);
  } while( true );
}

Assistant:

void
DeepScanLineInputFile::readPixels (int scanLine1, int scanLine2)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data destination.");

        int scanLineMin = min (scanLine1, scanLine2);
        int scanLineMax = max (scanLine1, scanLine2);

        if (scanLineMin < _data->minY || scanLineMax > _data->maxY)
            throw IEX_NAMESPACE::ArgExc ("Tried to read scan line outside "
                               "the image file's data window.");

        for (int i = scanLineMin; i <= scanLineMax; i++)
        {
            if (_data->gotSampleCount[i - _data->minY] == false)
                throw IEX_NAMESPACE::ArgExc ("Tried to read scan line without "
                                   "knowing the sample counts, please"
                                   "read the sample counts first.");
        }

 
        //
        // We impose a numbering scheme on the lineBuffers where the first
        // scanline is contained in lineBuffer 1.
        //
        // Determine the first and last lineBuffer numbers in this scanline
        // range. We always attempt to read the scanlines in the order that
        // they are stored in the file.
        //

        int start, stop, dl;

        if (_data->lineOrder == INCREASING_Y)
        {
            start = (scanLineMin - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMax - _data->minY) / _data->linesInBuffer + 1;
            dl = 1;
        }
        else
        {
            start = (scanLineMax - _data->minY) / _data->linesInBuffer;
            stop  = (scanLineMin - _data->minY) / _data->linesInBuffer - 1;
            dl = -1;
        }

        //
        // Create a task group for all line buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add the line buffer tasks.
            //
            // The tasks will execute in the order that they are created
            // because we lock the line buffers during construction and the
            // constructors are called by the main thread.  Hence, in order
            // for a successive task to execute the previous task which
            // used that line buffer must have completed already.
            //

            for (int l = start; l != stop; l += dl)
            {
                ThreadPool::addGlobalTask (newLineBufferTask (&taskGroup,
                                                              _data, l,
                                                              scanLineMin,
                                                              scanLineMax));
            }

            //
            // finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to ScanLineInputFile::readPixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
        {
            LineBuffer *lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}